

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

int __thiscall mpt::array::set(array *this,convertable *src)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char *pcStack_38;
  int len;
  char *data;
  iovec vec;
  convertable *src_local;
  array *this_local;
  
  vec.iov_len = (size_t)src;
  iVar1 = (**src->_vptr_convertable)(src,0x40,&data);
  if (iVar1 < 0) {
    iVar1 = (*(code *)**(undefined8 **)vec.iov_len)(vec.iov_len,0x43,&data);
    if (iVar1 < 0) {
      this_local._4_4_ =
           (*(code *)**(undefined8 **)vec.iov_len)(vec.iov_len,0x73,&stack0xffffffffffffffc8);
      if (-1 < this_local._4_4_) {
        if (this_local._4_4_ == 0) {
          this_local._4_4_ = -0x10;
        }
        else {
          sVar3 = strlen(pcStack_38);
          this_local._4_4_ = (int)sVar3;
          pvVar2 = set(this,(long)(this_local._4_4_ + 1),(void *)0x0);
          if (pvVar2 == (void *)0x0) {
            this_local._4_4_ = -4;
          }
          else {
            pvVar2 = base(this);
            memcpy(pvVar2,pcStack_38,(long)this_local._4_4_);
            *(undefined1 *)((long)pvVar2 + (long)this_local._4_4_) = 0;
          }
        }
      }
    }
    else {
      pvVar2 = set(this,(size_t)vec.iov_base,data);
      this_local._4_4_ = -4;
      if (pvVar2 != (void *)0x0) {
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    pvVar2 = set(this,(size_t)vec.iov_base,data);
    this_local._4_4_ = -4;
    if (pvVar2 != (void *)0x0) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int array::set(convertable &src)
{
	struct ::iovec vec;
	
	if (src.convert(TypeVector, &vec) >= 0) {
		return (set(vec.iov_len, vec.iov_base)) ? 0 : BadOperation;
	}
	if (src.convert(MPT_type_toVector('c'), &vec) >= 0) {
		return (set(vec.iov_len, vec.iov_base)) ? 0 : BadOperation;
	}
	char *data;
	int len;
	if ((len = src.convert('s', &data)) < 0) {
		return len;
	}
	if (!len) {
		return MissingData;
	}
	len = strlen(data);
	if (!set(len + 1)) {
		return BadOperation;
	}
	data = (char *) memcpy(base(), data, len);
	data[len] = 0;
	
	return len;
}